

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O0

void OpenMesh::IO::assignCustomProperty<double>
               (istream *_in,BaseImporter *_bi,VertexHandle _vh,string *_propName)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pvVar3;
  value_type local_38;
  double in;
  string *psStack_28;
  VPropHandleT<double> prop;
  string *_propName_local;
  BaseImporter *_bi_local;
  istream *_in_local;
  VertexHandle _vh_local;
  
  psStack_28 = _propName;
  VPropHandleT<double>::VPropHandleT((VPropHandleT<double> *)((long)&in + 4),-1);
  iVar2 = (*_bi->_vptr_BaseImporter[0x19])();
  bVar1 = BaseKernel::get_property_handle<double>
                    ((BaseKernel *)CONCAT44(extraout_var,iVar2),
                     (VPropHandleT<double> *)((long)&in + 4),psStack_28);
  if (!bVar1) {
    iVar2 = (*_bi->_vptr_BaseImporter[0x19])();
    BaseKernel::add_property<double>
              ((BaseKernel *)CONCAT44(extraout_var_00,iVar2),(VPropHandleT<double> *)((long)&in + 4)
               ,psStack_28);
  }
  std::istream::operator>>(_in,&local_38);
  iVar2 = (*_bi->_vptr_BaseImporter[0x19])();
  pvVar3 = BaseKernel::property<double>
                     ((BaseKernel *)CONCAT44(extraout_var_01,iVar2),(VPropHandleT<double>)in._4_4_,
                      _vh);
  *pvVar3 = local_38;
  return;
}

Assistant:

void assignCustomProperty(std::istream& _in, BaseImporter& _bi, VertexHandle _vh, const std::string& _propName)
{
  OpenMesh::VPropHandleT<T> prop;
  if (!_bi.kernel()->get_property_handle(prop,_propName))
    _bi.kernel()->add_property(prop,_propName);
  T in;
  _in >> in;
  _bi.kernel()->property(prop,_vh) = in;
}